

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GazetteerValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)2004>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined1 *puVar3;
  size_type sVar4;
  _Alloc_hider _Var5;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  ModelDescription *pMVar6;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  Result result;
  allocator_type local_99;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  undefined1 local_88 [24];
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  undefined1 local_60 [24];
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_48;
  TypeCase local_2c;
  
  pMVar6 = format->description_;
  if (pMVar6 == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] != 0x7d4) {
    local_98 = (undefined1  [8])local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Model not a gazetteer.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
    sVar4 = local_88._0_8_;
    _Var5._M_p = (pointer)local_98;
    if (local_98 == (undefined1  [8])local_88) {
      return __return_storage_ptr__;
    }
    goto LAB_002e7485;
  }
  Result::Result((Result *)local_98);
  local_2c = kStringType;
  __l._M_len = 1;
  __l._M_array = &local_2c;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector(&local_48,__l,&local_99);
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_70,(CoreML *)&pMVar6->input_,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_48,in_R8
            );
  local_98 = local_70;
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_68);
  if (local_68._M_p != local_60 + 8) {
    operator_delete(local_68._M_p,local_60._8_8_ + 1);
  }
  if (local_48.
      super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar2 = Result::good((Result *)local_98);
  if (bVar2) {
    local_2c = kStringType;
    __l_00._M_len = 1;
    __l_00._M_array = &local_2c;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_48,__l_00,&local_99);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_70,(CoreML *)&pMVar6->output_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_48,
               in_R8);
    local_98 = local_70;
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_68);
    if (local_68._M_p != local_60 + 8) {
      operator_delete(local_68._M_p,local_60._8_8_ + 1);
    }
    if (local_48.
        super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    bVar2 = Result::good((Result *)local_98);
    if (!bVar2) goto LAB_002e7424;
    if (format->_oneof_case_[0] == 0x7d4) {
      puVar3 = (undefined1 *)(format->Type_).textclassifier_;
    }
    else {
      puVar3 = Specification::CoreMLModels::_Gazetteer_default_instance_;
    }
    if (((TextClassifier *)puVar3)->revision_ < 2) {
      local_70 = (undefined1  [8])local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"Model revision number missing or invalid. Must be >= 2","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_70);
    }
    else if ((((TextClassifier *)puVar3)->_oneof_case_[0] == 0) ||
            ((((TextClassifier *)puVar3)->_oneof_case_[0] == 200 &&
             ((((((TextClassifier *)puVar3)->ClassLabels_).stringclasslabels_)->vector_).
              super_RepeatedPtrFieldBase.current_size_ < 1)))) {
      local_70 = (undefined1  [8])local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,
                 "Model output class label not set. Must have at least one class label","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_70);
    }
    else {
      if (*(long *)(((ulong)(((TextClassifier *)puVar3)->modelparameterdata_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8) != 0) goto LAB_002e7424;
      local_70 = (undefined1  [8])local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"Model parameter data not set","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_70);
    }
    if (local_70 != (undefined1  [8])local_60) {
      operator_delete((void *)local_70,local_60._0_8_ + 1);
    }
  }
  else {
LAB_002e7424:
    __return_storage_ptr__->m_type = local_98._0_4_;
    __return_storage_ptr__->m_reason = local_98._4_4_;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if (local_90._M_p == local_88 + 8) {
      paVar1->_M_allocated_capacity = CONCAT71(local_88._9_7_,local_88[8]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_88._16_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_90._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_88._9_7_,local_88[8]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_88._0_8_;
    local_88._0_8_ = 0;
    local_88[8] = '\0';
    local_90._M_p = local_88 + 8;
  }
  if (local_90._M_p == local_88 + 8) {
    return __return_storage_ptr__;
  }
  sVar4 = CONCAT71(local_88._9_7_,local_88[8]);
  _Var5._M_p = local_90._M_p;
LAB_002e7485:
  operator_delete(_Var5._M_p,sVar4 + 1);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_gazetteer>(const Specification::Model& format) {
        const auto& interface = format.description();
        
        // make sure model is a gazetteer
        if (!format.has_gazetteer()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a gazetteer.");
        }
        
        Result result;
        
        // Validate the inputs: only one input with string type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {Specification::FeatureType::kStringType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the output: only one output feature with string type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kStringType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the model parameters
        const auto &gazetteer = format.gazetteer();
        if (gazetteer.revision() < 2) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model revision number missing or invalid. Must be >= 2");
        }
        
        int numClassLabels;
        switch (gazetteer.ClassLabels_case()) {
            case Specification::CoreMLModels::Gazetteer::kStringClassLabels:
                numClassLabels = gazetteer.stringclasslabels().vector_size();
                break;
            case Specification::CoreMLModels::Gazetteer::CLASSLABELS_NOT_SET:
                numClassLabels = -1;
                break;
        }
        
        if (numClassLabels <= 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model output class label not set. Must have at least one class label");
        }
        
        if (gazetteer.modelparameterdata().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model parameter data not set");
        }
        
        return result;
    }